

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_NeuralNetwork_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0034f1b8 == '\x01') {
    DAT_0034f1b8 = '\0';
    (*(code *)*_NeuralNetwork_default_instance_)();
  }
  if (DAT_0034f1e8 == '\x01') {
    DAT_0034f1e8 = '\0';
    (*(code *)*_NeuralNetworkImageScaler_default_instance_)();
  }
  if (DAT_0034f218 == '\x01') {
    DAT_0034f218 = '\0';
    (*(code *)*_NeuralNetworkMeanImage_default_instance_)();
  }
  if (DAT_0034f248 == '\x01') {
    DAT_0034f248 = '\0';
    (*(code *)*_NeuralNetworkPreprocessing_default_instance_)();
  }
  if (DAT_0034f278 == '\x01') {
    DAT_0034f278 = '\0';
    (*(code *)*_ActivationReLU_default_instance_)();
  }
  if (DAT_0034f298 == '\x01') {
    DAT_0034f298 = '\0';
    (*(code *)*_ActivationLeakyReLU_default_instance_)();
  }
  if (DAT_0034f2b8 == '\x01') {
    DAT_0034f2b8 = '\0';
    (*(code *)*_ActivationTanh_default_instance_)();
  }
  if (DAT_0034f2e0 == '\x01') {
    DAT_0034f2e0 = '\0';
    (*(code *)*_ActivationScaledTanh_default_instance_)();
  }
  if (DAT_0034f300 == '\x01') {
    DAT_0034f300 = '\0';
    (*(code *)*_ActivationSigmoid_default_instance_)();
  }
  if (DAT_0034f328 == '\x01') {
    DAT_0034f328 = '\0';
    (*(code *)*_ActivationLinear_default_instance_)();
  }
  if (DAT_0034f350 == '\x01') {
    DAT_0034f350 = '\0';
    (*(code *)*_ActivationSigmoidHard_default_instance_)();
  }
  if (DAT_0034f378 == '\x01') {
    DAT_0034f378 = '\0';
    (*(code *)*_ActivationPReLU_default_instance_)();
  }
  if (DAT_0034f398 == '\x01') {
    DAT_0034f398 = '\0';
    (*(code *)*_ActivationELU_default_instance_)();
  }
  if (DAT_0034f3b8 == '\x01') {
    DAT_0034f3b8 = '\0';
    (*(code *)*_ActivationThresholdedReLU_default_instance_)();
  }
  if (DAT_0034f3d8 == '\x01') {
    DAT_0034f3d8 = '\0';
    (*(code *)*_ActivationSoftsign_default_instance_)();
  }
  if (DAT_0034f3f8 == '\x01') {
    DAT_0034f3f8 = '\0';
    (*(code *)*_ActivationSoftplus_default_instance_)();
  }
  if (DAT_0034f428 == '\x01') {
    DAT_0034f428 = '\0';
    (*(code *)*_ActivationParametricSoftplus_default_instance_)();
  }
  if (DAT_0034f450 == '\x01') {
    DAT_0034f450 = '\0';
    (*(code *)*_ActivationParams_default_instance_)();
  }
  if (DAT_0034f4f0 == '\x01') {
    DAT_0034f4f0 = '\0';
    (*(code *)*_Tensor_default_instance_)();
  }
  if (DAT_0034f588 == '\x01') {
    DAT_0034f588 = '\0';
    (*(code *)*_NeuralNetworkLayer_default_instance_)();
  }
  if (DAT_0034faa8 == '\x01') {
    DAT_0034faa8 = '\0';
    (*(code *)*_BranchLayerParams_default_instance_)();
  }
  if (DAT_0034fae8 == '\x01') {
    DAT_0034fae8 = '\0';
    (*(code *)*_LoopLayerParams_default_instance_)();
  }
  if (DAT_0034fb08 == '\x01') {
    DAT_0034fb08 = '\0';
    (*(code *)*_LoopBreakLayerParams_default_instance_)();
  }
  if (DAT_0034fb28 == '\x01') {
    DAT_0034fb28 = '\0';
    (*(code *)*_LoopContinueLayerParams_default_instance_)();
  }
  if (DAT_0034fb48 == '\x01') {
    DAT_0034fb48 = '\0';
    (*(code *)*_CopyLayerParams_default_instance_)();
  }
  if (DAT_0034fb68 == '\x01') {
    DAT_0034fb68 = '\0';
    (*(code *)*_GreaterThanLayerParams_default_instance_)();
  }
  if (DAT_0034fb88 == '\x01') {
    DAT_0034fb88 = '\0';
    (*(code *)*_GreaterEqualLayerParams_default_instance_)();
  }
  if (DAT_0034fba8 == '\x01') {
    DAT_0034fba8 = '\0';
    (*(code *)*_LessThanLayerParams_default_instance_)();
  }
  if (DAT_0034fbc8 == '\x01') {
    DAT_0034fbc8 = '\0';
    (*(code *)*_LessEqualLayerParams_default_instance_)();
  }
  if (DAT_0034fbe8 == '\x01') {
    DAT_0034fbe8 = '\0';
    (*(code *)*_EqualLayerParams_default_instance_)();
  }
  if (DAT_0034fc08 == '\x01') {
    DAT_0034fc08 = '\0';
    (*(code *)*_NotEqualLayerParams_default_instance_)();
  }
  if (DAT_0034fc28 == '\x01') {
    DAT_0034fc28 = '\0';
    (*(code *)*_LogicalAndLayerParams_default_instance_)();
  }
  if (DAT_0034fc48 == '\x01') {
    DAT_0034fc48 = '\0';
    (*(code *)*_LogicalOrLayerParams_default_instance_)();
  }
  if (DAT_0034fc68 == '\x01') {
    DAT_0034fc68 = '\0';
    (*(code *)*_LogicalXorLayerParams_default_instance_)();
  }
  if (DAT_0034fc88 == '\x01') {
    DAT_0034fc88 = '\0';
    (*(code *)*_LogicalNotLayerParams_default_instance_)();
  }
  if (DAT_0034fcb8 == '\x01') {
    DAT_0034fcb8 = '\0';
    (*(code *)*_BorderAmounts_EdgeSizes_default_instance_)();
  }
  if (DAT_0034fcf0 == '\x01') {
    DAT_0034fcf0 = '\0';
    (*(code *)*_BorderAmounts_default_instance_)();
  }
  if (DAT_0034fd18 == '\x01') {
    DAT_0034fd18 = '\0';
    (*(code *)*_ValidPadding_default_instance_)();
  }
  if (DAT_0034fd38 == '\x01') {
    DAT_0034fd38 = '\0';
    (*(code *)*_SamePadding_default_instance_)();
  }
  if (DAT_0034fd58 == '\x01') {
    DAT_0034fd58 = '\0';
    (*(code *)*_SamplingMode_default_instance_)();
  }
  if (DAT_0034fd78 == '\x01') {
    DAT_0034fd78 = '\0';
    (*(code *)*_BoxCoordinatesMode_default_instance_)();
  }
  if (DAT_0034fdd0 == '\x01') {
    DAT_0034fdd0 = '\0';
    (*(code *)*_WeightParams_default_instance_)();
  }
  if (DAT_0034fe00 == '\x01') {
    DAT_0034fe00 = '\0';
    (*(code *)*_QuantizationParams_default_instance_)();
  }
  if (DAT_0034fe58 == '\x01') {
    DAT_0034fe58 = '\0';
    (*(code *)*_LinearQuantizationParams_default_instance_)();
  }
  if (DAT_0034fe88 == '\x01') {
    DAT_0034fe88 = '\0';
    (*(code *)*_LookUpTableQuantizationParams_default_instance_)();
  }
  if (DAT_0034ff40 == '\x01') {
    DAT_0034ff40 = '\0';
    (*(code *)*_ConvolutionLayerParams_default_instance_)();
  }
  if (DAT_0034ffe8 == '\x01') {
    DAT_0034ffe8 = '\0';
    (*(code *)*_Convolution3DLayerParams_default_instance_)();
  }
  if (DAT_00350028 == '\x01') {
    DAT_00350028 = '\0';
    (*(code *)*_InnerProductLayerParams_default_instance_)();
  }
  if (DAT_00350068 == '\x01') {
    DAT_00350068 = '\0';
    (*(code *)*_EmbeddingLayerParams_default_instance_)();
  }
  if (DAT_003500a8 == '\x01') {
    DAT_003500a8 = '\0';
    (*(code *)*_EmbeddingNDLayerParams_default_instance_)();
  }
  if (DAT_003500f8 == '\x01') {
    DAT_003500f8 = '\0';
    (*(code *)*_BatchnormLayerParams_default_instance_)();
  }
  if (DAT_00350128 == '\x01') {
    DAT_00350128 = '\0';
    (*(code *)*_PoolingLayerParams_ValidCompletePadding_default_instance_)();
  }
  if (DAT_00350188 == '\x01') {
    DAT_00350188 = '\0';
    (*(code *)*_PoolingLayerParams_default_instance_)();
  }
  if (DAT_003501f8 == '\x01') {
    DAT_003501f8 = '\0';
    (*(code *)*_Pooling3DLayerParams_default_instance_)();
  }
  if (DAT_00350218 == '\x01') {
    DAT_00350218 = '\0';
    (*(code *)*_GlobalPooling3DLayerParams_default_instance_)();
  }
  if (DAT_00350238 == '\x01') {
    DAT_00350238 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingConstant_default_instance_)();
  }
  if (DAT_00350258 == '\x01') {
    DAT_00350258 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReflection_default_instance_)();
  }
  if (DAT_00350278 == '\x01') {
    DAT_00350278 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReplication_default_instance_)();
  }
  if (DAT_003502a8 == '\x01') {
    DAT_003502a8 = '\0';
    (*(code *)*_PaddingLayerParams_default_instance_)();
  }
  if (DAT_003502e0 == '\x01') {
    DAT_003502e0 = '\0';
    (*(code *)*_ConcatLayerParams_default_instance_)();
  }
  if (DAT_00350310 == '\x01') {
    DAT_00350310 = '\0';
    (*(code *)*_LRNLayerParams_default_instance_)();
  }
  if (DAT_00350330 == '\x01') {
    DAT_00350330 = '\0';
    (*(code *)*_SoftmaxLayerParams_default_instance_)();
  }
  if (DAT_00350358 == '\x01') {
    DAT_00350358 = '\0';
    (*(code *)*_SplitLayerParams_default_instance_)();
  }
  if (DAT_00350378 == '\x01') {
    DAT_00350378 = '\0';
    (*(code *)*_AddLayerParams_default_instance_)();
  }
  if (DAT_00350398 == '\x01') {
    DAT_00350398 = '\0';
    (*(code *)*_MultiplyLayerParams_default_instance_)();
  }
  if (DAT_003503c8 == '\x01') {
    DAT_003503c8 = '\0';
    (*(code *)*_UnaryFunctionLayerParams_default_instance_)();
  }
  if (DAT_00350418 == '\x01') {
    DAT_00350418 = '\0';
    (*(code *)*_UpsampleLayerParams_default_instance_)();
  }
  if (DAT_00350458 == '\x01') {
    DAT_00350458 = '\0';
    (*(code *)*_ResizeBilinearLayerParams_default_instance_)();
  }
  if (DAT_003504a8 == '\x01') {
    DAT_003504a8 = '\0';
    (*(code *)*_CropResizeLayerParams_default_instance_)();
  }
  if (DAT_003504e8 == '\x01') {
    DAT_003504e8 = '\0';
    (*(code *)*_BiasLayerParams_default_instance_)();
  }
  if (DAT_00350548 == '\x01') {
    DAT_00350548 = '\0';
    (*(code *)*_ScaleLayerParams_default_instance_)();
  }
  if (DAT_00350588 == '\x01') {
    DAT_00350588 = '\0';
    (*(code *)*_LoadConstantLayerParams_default_instance_)();
  }
  if (DAT_003505a8 == '\x01') {
    DAT_003505a8 = '\0';
    (*(code *)*_L2NormalizeLayerParams_default_instance_)();
  }
  if (DAT_003505c8 == '\x01') {
    DAT_003505c8 = '\0';
    (*(code *)*_FlattenLayerParams_default_instance_)();
  }
  if (DAT_00350600 == '\x01') {
    DAT_00350600 = '\0';
    (*(code *)*_ReshapeLayerParams_default_instance_)();
  }
  if (DAT_00350630 == '\x01') {
    DAT_00350630 = '\0';
    (*(code *)*_PermuteLayerParams_default_instance_)();
  }
  if (DAT_00350658 == '\x01') {
    DAT_00350658 = '\0';
    (*(code *)*_ReorganizeDataLayerParams_default_instance_)();
  }
  if (DAT_00350690 == '\x01') {
    DAT_00350690 = '\0';
    (*(code *)*_SliceLayerParams_default_instance_)();
  }
  if (DAT_003506b8 == '\x01') {
    DAT_003506b8 = '\0';
    (*(code *)*_ReduceLayerParams_default_instance_)();
  }
  if (DAT_003506f8 == '\x01') {
    DAT_003506f8 = '\0';
    (*(code *)*_CropLayerParams_default_instance_)();
  }
  if (DAT_00350718 == '\x01') {
    DAT_00350718 = '\0';
    (*(code *)*_AverageLayerParams_default_instance_)();
  }
  if (DAT_00350738 == '\x01') {
    DAT_00350738 = '\0';
    (*(code *)*_MaxLayerParams_default_instance_)();
  }
  if (DAT_00350758 == '\x01') {
    DAT_00350758 = '\0';
    (*(code *)*_MinLayerParams_default_instance_)();
  }
  if (DAT_00350778 == '\x01') {
    DAT_00350778 = '\0';
    (*(code *)*_DotProductLayerParams_default_instance_)();
  }
  if (DAT_003507a0 == '\x01') {
    DAT_003507a0 = '\0';
    (*(code *)*_MeanVarianceNormalizeLayerParams_default_instance_)();
  }
  if (DAT_003507c8 == '\x01') {
    DAT_003507c8 = '\0';
    (*(code *)*_SequenceRepeatLayerParams_default_instance_)();
  }
  if (DAT_00350818 == '\x01') {
    DAT_00350818 = '\0';
    (*(code *)*_SimpleRecurrentLayerParams_default_instance_)();
  }
  if (DAT_003508a8 == '\x01') {
    DAT_003508a8 = '\0';
    (*(code *)*_GRULayerParams_default_instance_)();
  }
  if (DAT_003508d0 == '\x01') {
    DAT_003508d0 = '\0';
    (*(code *)*_LSTMParams_default_instance_)();
  }
  if (DAT_00350968 == '\x01') {
    DAT_00350968 = '\0';
    (*(code *)*_LSTMWeightParams_default_instance_)();
  }
  if (DAT_003509c0 == '\x01') {
    DAT_003509c0 = '\0';
    (*(code *)*_UniDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00350a40 == '\x01') {
    DAT_00350a40 = '\0';
    (*(code *)*_BiDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00350a68 == '\x01') {
    DAT_00350a68 = '\0';
    (*(code *)*_CustomLayerParams_CustomLayerParamValue_default_instance_)();
  }
  if (DAT_00350b30 == '\x01') {
    DAT_00350b30 = '\0';
    (*(code *)*_CustomLayerParams_default_instance_)();
  }
  if (DAT_00350b60 == '\x01') {
    DAT_00350b60 = '\0';
    (*(code *)*_TransposeLayerParams_default_instance_)();
  }
  if (DAT_00350ba0 == '\x01') {
    DAT_00350ba0 = '\0';
    (*(code *)*_BatchedMatMulLayerParams_default_instance_)();
  }
  if (DAT_00350bc8 == '\x01') {
    DAT_00350bc8 = '\0';
    (*(code *)*_ConcatNDLayerParams_default_instance_)();
  }
  if (DAT_00350bf0 == '\x01') {
    DAT_00350bf0 = '\0';
    (*(code *)*_SoftmaxNDLayerParams_default_instance_)();
  }
  if (DAT_00350c20 == '\x01') {
    DAT_00350c20 = '\0';
    (*(code *)*_ReverseLayerParams_default_instance_)();
  }
  if (DAT_00350c50 == '\x01') {
    DAT_00350c50 = '\0';
    (*(code *)*_ReverseSeqLayerParams_default_instance_)();
  }
  if (DAT_00350c90 == '\x01') {
    DAT_00350c90 = '\0';
    (*(code *)*_LoadConstantNDLayerParams_default_instance_)();
  }
  if (DAT_00350cb0 == '\x01') {
    DAT_00350cb0 = '\0';
    (*(code *)*_FillLikeLayerParams_default_instance_)();
  }
  if (DAT_00350ce8 == '\x01') {
    DAT_00350ce8 = '\0';
    (*(code *)*_FillStaticLayerParams_default_instance_)();
  }
  if (DAT_00350d08 == '\x01') {
    DAT_00350d08 = '\0';
    (*(code *)*_FillDynamicLayerParams_default_instance_)();
  }
  if (DAT_00350d28 == '\x01') {
    DAT_00350d28 = '\0';
    (*(code *)*_WhereBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00350d48 == '\x01') {
    DAT_00350d48 = '\0';
    (*(code *)*_SinLayerParams_default_instance_)();
  }
  if (DAT_00350d68 == '\x01') {
    DAT_00350d68 = '\0';
    (*(code *)*_CosLayerParams_default_instance_)();
  }
  if (DAT_00350d88 == '\x01') {
    DAT_00350d88 = '\0';
    (*(code *)*_TanLayerParams_default_instance_)();
  }
  if (DAT_00350da8 == '\x01') {
    DAT_00350da8 = '\0';
    (*(code *)*_AsinLayerParams_default_instance_)();
  }
  if (DAT_00350dc8 == '\x01') {
    DAT_00350dc8 = '\0';
    (*(code *)*_AcosLayerParams_default_instance_)();
  }
  if (DAT_00350de8 == '\x01') {
    DAT_00350de8 = '\0';
    (*(code *)*_AtanLayerParams_default_instance_)();
  }
  if (DAT_00350e08 == '\x01') {
    DAT_00350e08 = '\0';
    (*(code *)*_SinhLayerParams_default_instance_)();
  }
  if (DAT_00350e28 == '\x01') {
    DAT_00350e28 = '\0';
    (*(code *)*_CoshLayerParams_default_instance_)();
  }
  if (DAT_00350e48 == '\x01') {
    DAT_00350e48 = '\0';
    (*(code *)*_TanhLayerParams_default_instance_)();
  }
  if (DAT_00350e68 == '\x01') {
    DAT_00350e68 = '\0';
    (*(code *)*_AsinhLayerParams_default_instance_)();
  }
  if (DAT_00350e88 == '\x01') {
    DAT_00350e88 = '\0';
    (*(code *)*_AcoshLayerParams_default_instance_)();
  }
  if (DAT_00350ea8 == '\x01') {
    DAT_00350ea8 = '\0';
    (*(code *)*_AtanhLayerParams_default_instance_)();
  }
  if (DAT_00350ec8 == '\x01') {
    DAT_00350ec8 = '\0';
    (*(code *)*_PowBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00350ee8 == '\x01') {
    DAT_00350ee8 = '\0';
    (*(code *)*_Exp2LayerParams_default_instance_)();
  }
  if (DAT_00350f08 == '\x01') {
    DAT_00350f08 = '\0';
    (*(code *)*_WhereNonZeroLayerParams_default_instance_)();
  }
  if (DAT_00350f38 == '\x01') {
    DAT_00350f38 = '\0';
    (*(code *)*_MatrixBandPartLayerParams_default_instance_)();
  }
  if (DAT_00350f60 == '\x01') {
    DAT_00350f60 = '\0';
    (*(code *)*_UpperTriangularLayerParams_default_instance_)();
  }
  if (DAT_00350f88 == '\x01') {
    DAT_00350f88 = '\0';
    (*(code *)*_LowerTriangularLayerParams_default_instance_)();
  }
  if (DAT_00350fa8 == '\x01') {
    DAT_00350fa8 = '\0';
    (*(code *)*_BroadcastToLikeLayerParams_default_instance_)();
  }
  if (DAT_00350fd8 == '\x01') {
    DAT_00350fd8 = '\0';
    (*(code *)*_BroadcastToStaticLayerParams_default_instance_)();
  }
  if (DAT_00350ff8 == '\x01') {
    DAT_00350ff8 = '\0';
    (*(code *)*_BroadcastToDynamicLayerParams_default_instance_)();
  }
  if (DAT_00351018 == '\x01') {
    DAT_00351018 = '\0';
    (*(code *)*_AddBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00351038 == '\x01') {
    DAT_00351038 = '\0';
    (*(code *)*_MaxBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00351058 == '\x01') {
    DAT_00351058 = '\0';
    (*(code *)*_MinBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00351078 == '\x01') {
    DAT_00351078 = '\0';
    (*(code *)*_ModBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00351098 == '\x01') {
    DAT_00351098 = '\0';
    (*(code *)*_FloorDivBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_003510b8 == '\x01') {
    DAT_003510b8 = '\0';
    (*(code *)*_SubtractBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_003510d8 == '\x01') {
    DAT_003510d8 = '\0';
    (*(code *)*_MultiplyBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_003510f8 == '\x01') {
    DAT_003510f8 = '\0';
    (*(code *)*_DivideBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00351120 == '\x01') {
    DAT_00351120 = '\0';
    (*(code *)*_GatherLayerParams_default_instance_)();
  }
  if (DAT_00351148 == '\x01') {
    DAT_00351148 = '\0';
    (*(code *)*_ScatterLayerParams_default_instance_)();
  }
  if (DAT_00351168 == '\x01') {
    DAT_00351168 = '\0';
    (*(code *)*_GatherNDLayerParams_default_instance_)();
  }
  if (DAT_00351188 == '\x01') {
    DAT_00351188 = '\0';
    (*(code *)*_ScatterNDLayerParams_default_instance_)();
  }
  if (DAT_003511b0 == '\x01') {
    DAT_003511b0 = '\0';
    (*(code *)*_GatherAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_003511d8 == '\x01') {
    DAT_003511d8 = '\0';
    (*(code *)*_ScatterAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_00351200 == '\x01') {
    DAT_00351200 = '\0';
    (*(code *)*_StackLayerParams_default_instance_)();
  }
  if (DAT_00351230 == '\x01') {
    DAT_00351230 = '\0';
    (*(code *)*_RankPreservingReshapeLayerParams_default_instance_)();
  }
  if (DAT_00351268 == '\x01') {
    DAT_00351268 = '\0';
    (*(code *)*_ConstantPaddingLayerParams_default_instance_)();
  }
  if (DAT_00351298 == '\x01') {
    DAT_00351298 = '\0';
    (*(code *)*_RandomNormalLikeLayerParams_default_instance_)();
  }
  if (DAT_003512e0 == '\x01') {
    DAT_003512e0 = '\0';
    (*(code *)*_RandomNormalStaticLayerParams_default_instance_)();
  }
  if (DAT_00351310 == '\x01') {
    DAT_00351310 = '\0';
    (*(code *)*_RandomNormalDynamicLayerParams_default_instance_)();
  }
  if (DAT_00351340 == '\x01') {
    DAT_00351340 = '\0';
    (*(code *)*_RandomUniformLikeLayerParams_default_instance_)();
  }
  if (DAT_00351388 == '\x01') {
    DAT_00351388 = '\0';
    (*(code *)*_RandomUniformStaticLayerParams_default_instance_)();
  }
  if (DAT_003513b8 == '\x01') {
    DAT_003513b8 = '\0';
    (*(code *)*_RandomUniformDynamicLayerParams_default_instance_)();
  }
  if (DAT_003513e0 == '\x01') {
    DAT_003513e0 = '\0';
    (*(code *)*_RandomBernoulliLikeLayerParams_default_instance_)();
  }
  if (DAT_00351420 == '\x01') {
    DAT_00351420 = '\0';
    (*(code *)*_RandomBernoulliStaticLayerParams_default_instance_)();
  }
  if (DAT_00351448 == '\x01') {
    DAT_00351448 = '\0';
    (*(code *)*_RandomBernoulliDynamicLayerParams_default_instance_)();
  }
  if (DAT_00351480 == '\x01') {
    DAT_00351480 = '\0';
    (*(code *)*_CategoricalDistributionLayerParams_default_instance_)();
  }
  if (DAT_003514b8 == '\x01') {
    DAT_003514b8 = '\0';
    (*(code *)*_ReduceL1LayerParams_default_instance_)();
  }
  if (DAT_003514f0 == '\x01') {
    DAT_003514f0 = '\0';
    (*(code *)*_ReduceL2LayerParams_default_instance_)();
  }
  if (DAT_00351528 == '\x01') {
    DAT_00351528 = '\0';
    (*(code *)*_ReduceMaxLayerParams_default_instance_)();
  }
  if (DAT_00351560 == '\x01') {
    DAT_00351560 = '\0';
    (*(code *)*_ReduceMinLayerParams_default_instance_)();
  }
  if (DAT_00351598 == '\x01') {
    DAT_00351598 = '\0';
    (*(code *)*_ReduceSumLayerParams_default_instance_)();
  }
  if (DAT_003515d0 == '\x01') {
    DAT_003515d0 = '\0';
    (*(code *)*_ReduceProdLayerParams_default_instance_)();
  }
  if (DAT_00351608 == '\x01') {
    DAT_00351608 = '\0';
    (*(code *)*_ReduceMeanLayerParams_default_instance_)();
  }
  if (DAT_00351640 == '\x01') {
    DAT_00351640 = '\0';
    (*(code *)*_ReduceLogSumLayerParams_default_instance_)();
  }
  if (DAT_00351678 == '\x01') {
    DAT_00351678 = '\0';
    (*(code *)*_ReduceSumSquareLayerParams_default_instance_)();
  }
  if (DAT_003516b0 == '\x01') {
    DAT_003516b0 = '\0';
    (*(code *)*_ReduceLogSumExpLayerParams_default_instance_)();
  }
  if (DAT_003516e0 == '\x01') {
    DAT_003516e0 = '\0';
    (*(code *)*_ExpandDimsLayerParams_default_instance_)();
  }
  if (DAT_00351708 == '\x01') {
    DAT_00351708 = '\0';
    (*(code *)*_FlattenTo2DLayerParams_default_instance_)();
  }
  if (DAT_00351738 == '\x01') {
    DAT_00351738 = '\0';
    (*(code *)*_ReshapeStaticLayerParams_default_instance_)();
  }
  if (DAT_00351758 == '\x01') {
    DAT_00351758 = '\0';
    (*(code *)*_ReshapeLikeLayerParams_default_instance_)();
  }
  if (DAT_00351778 == '\x01') {
    DAT_00351778 = '\0';
    (*(code *)*_ReshapeDynamicLayerParams_default_instance_)();
  }
  if (DAT_003517b0 == '\x01') {
    DAT_003517b0 = '\0';
    (*(code *)*_SqueezeLayerParams_default_instance_)();
  }
  if (DAT_003517e0 == '\x01') {
    DAT_003517e0 = '\0';
    (*(code *)*_TopKLayerParams_default_instance_)();
  }
  if (DAT_00351808 == '\x01') {
    DAT_00351808 = '\0';
    (*(code *)*_ArgMaxLayerParams_default_instance_)();
  }
  if (DAT_00351830 == '\x01') {
    DAT_00351830 = '\0';
    (*(code *)*_ArgMinLayerParams_default_instance_)();
  }
  if (DAT_00351878 == '\x01') {
    DAT_00351878 = '\0';
    (*(code *)*_SplitNDLayerParams_default_instance_)();
  }
  if (DAT_00351898 == '\x01') {
    DAT_00351898 = '\0';
    (*(code *)*_CeilLayerParams_default_instance_)();
  }
  if (DAT_003518b8 == '\x01') {
    DAT_003518b8 = '\0';
    (*(code *)*_RoundLayerParams_default_instance_)();
  }
  if (DAT_003518d8 == '\x01') {
    DAT_003518d8 = '\0';
    (*(code *)*_FloorLayerParams_default_instance_)();
  }
  if (DAT_003518f8 == '\x01') {
    DAT_003518f8 = '\0';
    (*(code *)*_SignLayerParams_default_instance_)();
  }
  if (DAT_00351920 == '\x01') {
    DAT_00351920 = '\0';
    (*(code *)*_ClipLayerParams_default_instance_)();
  }
  if (DAT_003519c8 == '\x01') {
    DAT_003519c8 = '\0';
    (*(code *)*_SliceStaticLayerParams_default_instance_)();
  }
  if (DAT_00351a58 == '\x01') {
    DAT_00351a58 = '\0';
    (*(code *)*_SliceDynamicLayerParams_default_instance_)();
  }
  if (DAT_00351a88 == '\x01') {
    DAT_00351a88 = '\0';
    (*(code *)*_TileLayerParams_default_instance_)();
  }
  if (DAT_00351aa8 == '\x01') {
    DAT_00351aa8 = '\0';
    (*(code *)*_GetShapeLayerParams_default_instance_)();
  }
  if (DAT_00351ac8 == '\x01') {
    DAT_00351ac8 = '\0';
    (*(code *)*_ErfLayerParams_default_instance_)();
  }
  if (DAT_00351ae8 == '\x01') {
    DAT_00351ae8 = '\0';
    (*(code *)*_GeluLayerParams_default_instance_)();
  }
  if (DAT_00351b10 == '\x01') {
    DAT_00351b10 = '\0';
    (*(code *)*_RangeStaticLayerParams_default_instance_)();
  }
  if (DAT_00351b38 == '\x01') {
    DAT_00351b38 = '\0';
    (*(code *)*_RangeDynamicLayerParams_default_instance_)();
  }
  if (DAT_00351b70 == '\x01') {
    DAT_00351b70 = '\0';
    (*(code *)*_SlidingWindowsLayerParams_default_instance_)();
  }
  if (DAT_00351bb8 == '\x01') {
    DAT_00351bb8 = '\0';
    (*(code *)*_LayerNormalizationLayerParams_default_instance_)();
  }
  if (DAT_00351be8 == '\x01') {
    DAT_00351be8 = '\0';
    (*(code *)*_NonMaximumSuppressionLayerParams_default_instance_)();
  }
  if (DAT_00351c10 == '\x01') {
    DAT_00351c10 = '\0';
    (*(code *)*_ClampedReLULayerParams_default_instance_)();
  }
  if (DAT_00351c38 == '\x01') {
    DAT_00351c38 = '\0';
    (*(code *)*_ArgSortLayerParams_default_instance_)();
  }
  if (DAT_00351c68 == '\x01') {
    DAT_00351c68 = '\0';
    (*(code *)*_SliceBySizeLayerParams_default_instance_)();
  }
  if (DAT_00351cd8 == '\x01') {
    DAT_00351cd8 = '\0';
    (*(code *)*_NeuralNetworkClassifier_default_instance_)();
  }
  if (DAT_00351d20 == '\x01') {
    DAT_00351d20 = '\0';
    (*(code *)*_OneHotLayerParams_default_instance_)();
  }
  if (DAT_00351d48 == '\x01') {
    DAT_00351d48 = '\0';
    (*(code *)*_CumSumLayerParams_default_instance_)();
  }
  if (DAT_00351da8 == '\x01') {
    DAT_00351da8 = '\0';
    (*(code *)*_NeuralNetworkRegressor_default_instance_)();
  }
  if (DAT_00351e00 == '\x01') {
    DAT_00351e00 = '\0';
    (*(code *)*_NetworkUpdateParameters_default_instance_)();
  }
  if (DAT_00351e30 == '\x01') {
    DAT_00351e30 = '\0';
    (*(code *)*_LossLayer_default_instance_)();
  }
  if (DAT_00351e70 == '\x01') {
    DAT_00351e70 = '\0';
    (*(code *)*_CategoricalCrossEntropyLossLayer_default_instance_)();
  }
  if (DAT_00351ea0 == '\x01') {
    DAT_00351ea0 = '\0';
    (*(code *)*_MeanSquaredErrorLossLayer_default_instance_)();
  }
  if (DAT_00351ec8 == '\x01') {
    DAT_00351ec8 = '\0';
    (*(code *)*_Optimizer_default_instance_)();
  }
  if (DAT_00351f10 == '\x01') {
    DAT_00351f10 = '\0';
    (*(code *)*_SGDOptimizer_default_instance_)();
  }
  if (DAT_00351f58 == '\x01') {
    DAT_00351f58 = 0;
    (*(code *)*_AdamOptimizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NeuralNetwork_default_instance_.Shutdown();
  _NeuralNetworkImageScaler_default_instance_.Shutdown();
  _NeuralNetworkMeanImage_default_instance_.Shutdown();
  _NeuralNetworkPreprocessing_default_instance_.Shutdown();
  _ActivationReLU_default_instance_.Shutdown();
  _ActivationLeakyReLU_default_instance_.Shutdown();
  _ActivationTanh_default_instance_.Shutdown();
  _ActivationScaledTanh_default_instance_.Shutdown();
  _ActivationSigmoid_default_instance_.Shutdown();
  _ActivationLinear_default_instance_.Shutdown();
  _ActivationSigmoidHard_default_instance_.Shutdown();
  _ActivationPReLU_default_instance_.Shutdown();
  _ActivationELU_default_instance_.Shutdown();
  _ActivationThresholdedReLU_default_instance_.Shutdown();
  _ActivationSoftsign_default_instance_.Shutdown();
  _ActivationSoftplus_default_instance_.Shutdown();
  _ActivationParametricSoftplus_default_instance_.Shutdown();
  _ActivationParams_default_instance_.Shutdown();
  _Tensor_default_instance_.Shutdown();
  _NeuralNetworkLayer_default_instance_.Shutdown();
  _BranchLayerParams_default_instance_.Shutdown();
  _LoopLayerParams_default_instance_.Shutdown();
  _LoopBreakLayerParams_default_instance_.Shutdown();
  _LoopContinueLayerParams_default_instance_.Shutdown();
  _CopyLayerParams_default_instance_.Shutdown();
  _GreaterThanLayerParams_default_instance_.Shutdown();
  _GreaterEqualLayerParams_default_instance_.Shutdown();
  _LessThanLayerParams_default_instance_.Shutdown();
  _LessEqualLayerParams_default_instance_.Shutdown();
  _EqualLayerParams_default_instance_.Shutdown();
  _NotEqualLayerParams_default_instance_.Shutdown();
  _LogicalAndLayerParams_default_instance_.Shutdown();
  _LogicalOrLayerParams_default_instance_.Shutdown();
  _LogicalXorLayerParams_default_instance_.Shutdown();
  _LogicalNotLayerParams_default_instance_.Shutdown();
  _BorderAmounts_EdgeSizes_default_instance_.Shutdown();
  _BorderAmounts_default_instance_.Shutdown();
  _ValidPadding_default_instance_.Shutdown();
  _SamePadding_default_instance_.Shutdown();
  _SamplingMode_default_instance_.Shutdown();
  _BoxCoordinatesMode_default_instance_.Shutdown();
  _WeightParams_default_instance_.Shutdown();
  _QuantizationParams_default_instance_.Shutdown();
  _LinearQuantizationParams_default_instance_.Shutdown();
  _LookUpTableQuantizationParams_default_instance_.Shutdown();
  _ConvolutionLayerParams_default_instance_.Shutdown();
  _Convolution3DLayerParams_default_instance_.Shutdown();
  _InnerProductLayerParams_default_instance_.Shutdown();
  _EmbeddingLayerParams_default_instance_.Shutdown();
  _EmbeddingNDLayerParams_default_instance_.Shutdown();
  _BatchnormLayerParams_default_instance_.Shutdown();
  _PoolingLayerParams_ValidCompletePadding_default_instance_.Shutdown();
  _PoolingLayerParams_default_instance_.Shutdown();
  _Pooling3DLayerParams_default_instance_.Shutdown();
  _GlobalPooling3DLayerParams_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingConstant_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReflection_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReplication_default_instance_.Shutdown();
  _PaddingLayerParams_default_instance_.Shutdown();
  _ConcatLayerParams_default_instance_.Shutdown();
  _LRNLayerParams_default_instance_.Shutdown();
  _SoftmaxLayerParams_default_instance_.Shutdown();
  _SplitLayerParams_default_instance_.Shutdown();
  _AddLayerParams_default_instance_.Shutdown();
  _MultiplyLayerParams_default_instance_.Shutdown();
  _UnaryFunctionLayerParams_default_instance_.Shutdown();
  _UpsampleLayerParams_default_instance_.Shutdown();
  _ResizeBilinearLayerParams_default_instance_.Shutdown();
  _CropResizeLayerParams_default_instance_.Shutdown();
  _BiasLayerParams_default_instance_.Shutdown();
  _ScaleLayerParams_default_instance_.Shutdown();
  _LoadConstantLayerParams_default_instance_.Shutdown();
  _L2NormalizeLayerParams_default_instance_.Shutdown();
  _FlattenLayerParams_default_instance_.Shutdown();
  _ReshapeLayerParams_default_instance_.Shutdown();
  _PermuteLayerParams_default_instance_.Shutdown();
  _ReorganizeDataLayerParams_default_instance_.Shutdown();
  _SliceLayerParams_default_instance_.Shutdown();
  _ReduceLayerParams_default_instance_.Shutdown();
  _CropLayerParams_default_instance_.Shutdown();
  _AverageLayerParams_default_instance_.Shutdown();
  _MaxLayerParams_default_instance_.Shutdown();
  _MinLayerParams_default_instance_.Shutdown();
  _DotProductLayerParams_default_instance_.Shutdown();
  _MeanVarianceNormalizeLayerParams_default_instance_.Shutdown();
  _SequenceRepeatLayerParams_default_instance_.Shutdown();
  _SimpleRecurrentLayerParams_default_instance_.Shutdown();
  _GRULayerParams_default_instance_.Shutdown();
  _LSTMParams_default_instance_.Shutdown();
  _LSTMWeightParams_default_instance_.Shutdown();
  _UniDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _BiDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _CustomLayerParams_CustomLayerParamValue_default_instance_.Shutdown();
  _CustomLayerParams_default_instance_.Shutdown();
  _TransposeLayerParams_default_instance_.Shutdown();
  _BatchedMatMulLayerParams_default_instance_.Shutdown();
  _ConcatNDLayerParams_default_instance_.Shutdown();
  _SoftmaxNDLayerParams_default_instance_.Shutdown();
  _ReverseLayerParams_default_instance_.Shutdown();
  _ReverseSeqLayerParams_default_instance_.Shutdown();
  _LoadConstantNDLayerParams_default_instance_.Shutdown();
  _FillLikeLayerParams_default_instance_.Shutdown();
  _FillStaticLayerParams_default_instance_.Shutdown();
  _FillDynamicLayerParams_default_instance_.Shutdown();
  _WhereBroadcastableLayerParams_default_instance_.Shutdown();
  _SinLayerParams_default_instance_.Shutdown();
  _CosLayerParams_default_instance_.Shutdown();
  _TanLayerParams_default_instance_.Shutdown();
  _AsinLayerParams_default_instance_.Shutdown();
  _AcosLayerParams_default_instance_.Shutdown();
  _AtanLayerParams_default_instance_.Shutdown();
  _SinhLayerParams_default_instance_.Shutdown();
  _CoshLayerParams_default_instance_.Shutdown();
  _TanhLayerParams_default_instance_.Shutdown();
  _AsinhLayerParams_default_instance_.Shutdown();
  _AcoshLayerParams_default_instance_.Shutdown();
  _AtanhLayerParams_default_instance_.Shutdown();
  _PowBroadcastableLayerParams_default_instance_.Shutdown();
  _Exp2LayerParams_default_instance_.Shutdown();
  _WhereNonZeroLayerParams_default_instance_.Shutdown();
  _MatrixBandPartLayerParams_default_instance_.Shutdown();
  _UpperTriangularLayerParams_default_instance_.Shutdown();
  _LowerTriangularLayerParams_default_instance_.Shutdown();
  _BroadcastToLikeLayerParams_default_instance_.Shutdown();
  _BroadcastToStaticLayerParams_default_instance_.Shutdown();
  _BroadcastToDynamicLayerParams_default_instance_.Shutdown();
  _AddBroadcastableLayerParams_default_instance_.Shutdown();
  _MaxBroadcastableLayerParams_default_instance_.Shutdown();
  _MinBroadcastableLayerParams_default_instance_.Shutdown();
  _ModBroadcastableLayerParams_default_instance_.Shutdown();
  _FloorDivBroadcastableLayerParams_default_instance_.Shutdown();
  _SubtractBroadcastableLayerParams_default_instance_.Shutdown();
  _MultiplyBroadcastableLayerParams_default_instance_.Shutdown();
  _DivideBroadcastableLayerParams_default_instance_.Shutdown();
  _GatherLayerParams_default_instance_.Shutdown();
  _ScatterLayerParams_default_instance_.Shutdown();
  _GatherNDLayerParams_default_instance_.Shutdown();
  _ScatterNDLayerParams_default_instance_.Shutdown();
  _GatherAlongAxisLayerParams_default_instance_.Shutdown();
  _ScatterAlongAxisLayerParams_default_instance_.Shutdown();
  _StackLayerParams_default_instance_.Shutdown();
  _RankPreservingReshapeLayerParams_default_instance_.Shutdown();
  _ConstantPaddingLayerParams_default_instance_.Shutdown();
  _RandomNormalLikeLayerParams_default_instance_.Shutdown();
  _RandomNormalStaticLayerParams_default_instance_.Shutdown();
  _RandomNormalDynamicLayerParams_default_instance_.Shutdown();
  _RandomUniformLikeLayerParams_default_instance_.Shutdown();
  _RandomUniformStaticLayerParams_default_instance_.Shutdown();
  _RandomUniformDynamicLayerParams_default_instance_.Shutdown();
  _RandomBernoulliLikeLayerParams_default_instance_.Shutdown();
  _RandomBernoulliStaticLayerParams_default_instance_.Shutdown();
  _RandomBernoulliDynamicLayerParams_default_instance_.Shutdown();
  _CategoricalDistributionLayerParams_default_instance_.Shutdown();
  _ReduceL1LayerParams_default_instance_.Shutdown();
  _ReduceL2LayerParams_default_instance_.Shutdown();
  _ReduceMaxLayerParams_default_instance_.Shutdown();
  _ReduceMinLayerParams_default_instance_.Shutdown();
  _ReduceSumLayerParams_default_instance_.Shutdown();
  _ReduceProdLayerParams_default_instance_.Shutdown();
  _ReduceMeanLayerParams_default_instance_.Shutdown();
  _ReduceLogSumLayerParams_default_instance_.Shutdown();
  _ReduceSumSquareLayerParams_default_instance_.Shutdown();
  _ReduceLogSumExpLayerParams_default_instance_.Shutdown();
  _ExpandDimsLayerParams_default_instance_.Shutdown();
  _FlattenTo2DLayerParams_default_instance_.Shutdown();
  _ReshapeStaticLayerParams_default_instance_.Shutdown();
  _ReshapeLikeLayerParams_default_instance_.Shutdown();
  _ReshapeDynamicLayerParams_default_instance_.Shutdown();
  _SqueezeLayerParams_default_instance_.Shutdown();
  _TopKLayerParams_default_instance_.Shutdown();
  _ArgMaxLayerParams_default_instance_.Shutdown();
  _ArgMinLayerParams_default_instance_.Shutdown();
  _SplitNDLayerParams_default_instance_.Shutdown();
  _CeilLayerParams_default_instance_.Shutdown();
  _RoundLayerParams_default_instance_.Shutdown();
  _FloorLayerParams_default_instance_.Shutdown();
  _SignLayerParams_default_instance_.Shutdown();
  _ClipLayerParams_default_instance_.Shutdown();
  _SliceStaticLayerParams_default_instance_.Shutdown();
  _SliceDynamicLayerParams_default_instance_.Shutdown();
  _TileLayerParams_default_instance_.Shutdown();
  _GetShapeLayerParams_default_instance_.Shutdown();
  _ErfLayerParams_default_instance_.Shutdown();
  _GeluLayerParams_default_instance_.Shutdown();
  _RangeStaticLayerParams_default_instance_.Shutdown();
  _RangeDynamicLayerParams_default_instance_.Shutdown();
  _SlidingWindowsLayerParams_default_instance_.Shutdown();
  _LayerNormalizationLayerParams_default_instance_.Shutdown();
  _NonMaximumSuppressionLayerParams_default_instance_.Shutdown();
  _ClampedReLULayerParams_default_instance_.Shutdown();
  _ArgSortLayerParams_default_instance_.Shutdown();
  _SliceBySizeLayerParams_default_instance_.Shutdown();
  _NeuralNetworkClassifier_default_instance_.Shutdown();
  _OneHotLayerParams_default_instance_.Shutdown();
  _CumSumLayerParams_default_instance_.Shutdown();
  _NeuralNetworkRegressor_default_instance_.Shutdown();
  _NetworkUpdateParameters_default_instance_.Shutdown();
  _LossLayer_default_instance_.Shutdown();
  _CategoricalCrossEntropyLossLayer_default_instance_.Shutdown();
  _MeanSquaredErrorLossLayer_default_instance_.Shutdown();
  _Optimizer_default_instance_.Shutdown();
  _SGDOptimizer_default_instance_.Shutdown();
  _AdamOptimizer_default_instance_.Shutdown();
}